

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  const_iterator __position;
  FileDescriptor **ppFVar1;
  FileDescriptor *this_00;
  FileDescriptor *pFVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  pointer ppFVar5;
  int *piVar6;
  ostream *poVar7;
  char *pcVar8;
  size_t sVar9;
  pointer ppFVar10;
  _Base_ptr p_Var11;
  bool bVar12;
  int iVar13;
  FileDescriptor **__v;
  _Base_ptr p_Var14;
  const_iterator cVar15;
  ulong uVar16;
  FileOutputStream out;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  to_output;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  FileDescriptorSet file_set;
  FileOutputStream local_128;
  undefined1 local_e0 [16];
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  size_t local_b8;
  bool local_a6;
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_90;
  FileDescriptorSet local_60;
  
  FileDescriptorSet::FileDescriptorSet(&local_60,(Arena *)0x0,false);
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if (this->imports_in_descriptor_set_ == false) {
    __position._M_node = (_Base_ptr)(local_e0 + 8);
    local_e0._8_4_ = _S_red;
    local_d0 = (_Base_ptr)0x0;
    local_b8 = 0;
    __v = (parsed_files->
          super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_128.super_CopyingOutputStreamAdaptor.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream
         = (_func_int **)local_e0;
    local_c8 = __position._M_node;
    local_c0 = __position._M_node;
    if (__v != ppFVar1) {
      do {
        std::
        _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
        ::
        _M_insert_unique_<google::protobuf::FileDescriptor_const*const&,std::_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>::_Alloc_node>
                  ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                    *)local_e0,__position,__v,(_Alloc_node *)&local_128);
        __v = __v + 1;
      } while (__v != ppFVar1);
      ppFVar5 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppFVar10 = (parsed_files->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      if (ppFVar10 != ppFVar5) {
        uVar16 = 0;
        do {
          this_00 = ppFVar5[uVar16];
          if (0 < *(int *)(this_00 + 0x20)) {
            iVar13 = 0;
            do {
              local_128.super_CopyingOutputStreamAdaptor.super_ZeroCopyOutputStream.
              _vptr_ZeroCopyOutputStream = (_func_int **)FileDescriptor::dependency(this_00,iVar13);
              p_Var3 = local_d0;
              cVar15._M_node = __position._M_node;
              if (local_d0 == (_Base_ptr)0x0) {
LAB_00230e5a:
                std::
                _Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                ::_M_insert_unique<google::protobuf::FileDescriptor_const*const&>
                          ((_Rb_tree<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*,std::_Identity<google::protobuf::FileDescriptor_const*>,std::less<google::protobuf::FileDescriptor_const*>,std::allocator<google::protobuf::FileDescriptor_const*>>
                            *)&local_90,(FileDescriptor **)&local_128);
              }
              else {
                do {
                  p_Var14 = cVar15._M_node;
                  p_Var11 = p_Var3;
                  pFVar2 = *(FileDescriptor **)(p_Var11 + 1);
                  cVar15._M_node = p_Var11;
                  if (pFVar2 < local_128.super_CopyingOutputStreamAdaptor.super_ZeroCopyOutputStream
                               ._vptr_ZeroCopyOutputStream) {
                    cVar15._M_node = p_Var14;
                  }
                  p_Var3 = (&p_Var11->_M_left)
                           [pFVar2 < local_128.super_CopyingOutputStreamAdaptor.
                                     super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream];
                } while ((&p_Var11->_M_left)
                         [pFVar2 < local_128.super_CopyingOutputStreamAdaptor.
                                   super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream] !=
                         (_Base_ptr)0x0);
                if (cVar15._M_node == __position._M_node) goto LAB_00230e5a;
                if (pFVar2 < local_128.super_CopyingOutputStreamAdaptor.super_ZeroCopyOutputStream.
                             _vptr_ZeroCopyOutputStream) {
                  p_Var11 = p_Var14;
                }
                if (local_128.super_CopyingOutputStreamAdaptor.super_ZeroCopyOutputStream.
                    _vptr_ZeroCopyOutputStream < *(FileDescriptor **)(p_Var11 + 1))
                goto LAB_00230e5a;
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < *(int *)(this_00 + 0x20));
            ppFVar5 = (parsed_files->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            ppFVar10 = (parsed_files->
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < (ulong)((long)ppFVar10 - (long)ppFVar5 >> 3));
      }
    }
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree((_Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)local_e0);
  }
  ppFVar5 = (parsed_files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((parsed_files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
    uVar16 = 0;
    do {
      GetTransitiveDependencies
                (ppFVar5[uVar16],true,this->source_info_in_descriptor_set_,
                 (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)&local_90,&local_60.file_);
      uVar16 = uVar16 + 1;
      ppFVar5 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)((long)(parsed_files->
                                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3
                             ));
  }
  do {
    iVar13 = open((this->descriptor_set_out_name_)._M_dataplus._M_p,0x241,0x1b6);
    if (-1 < iVar13) {
      io::FileOutputStream::FileOutputStream(&local_128,iVar13,-1);
      io::CodedOutputStream::CodedOutputStream
                ((CodedOutputStream *)local_e0,(ZeroCopyOutputStream *)&local_128,true);
      local_a6 = true;
      bVar4 = MessageLite::SerializeToCodedStream
                        ((MessageLite *)&local_60,(CodedOutputStream *)local_e0);
      if (bVar4) {
        io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_e0);
        bVar4 = io::FileOutputStream::Close(&local_128);
        bVar12 = true;
        if (!bVar4) {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,
                              (this->descriptor_set_out_name_)._M_dataplus._M_p,
                              (this->descriptor_set_out_name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
          pcVar8 = strerror(local_128.copying_output_.errno_);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar9);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          goto LAB_002310d6;
        }
      }
      else {
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->descriptor_set_out_name_)._M_dataplus._M_p,
                            (this->descriptor_set_out_name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
        pcVar8 = strerror(local_128.copying_output_.errno_);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar8,sVar9);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        io::FileOutputStream::Close(&local_128);
        io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_e0);
LAB_002310d6:
        bVar12 = false;
      }
      io::FileOutputStream::~FileOutputStream(&local_128);
      goto LAB_002310e2;
    }
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  perror((this->descriptor_set_out_name_)._M_dataplus._M_p);
  bVar12 = false;
LAB_002310e2:
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Rb_tree(&local_90);
  FileDescriptorSet::~FileDescriptorSet(&local_60);
  return bVar12;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const std::vector<const FileDescriptor*>& parsed_files) {
  FileDescriptorSet file_set;

  std::set<const FileDescriptor*> already_seen;
  if (!imports_in_descriptor_set_) {
    // Since we don't want to output transitive dependencies, but we do want
    // things to be in dependency order, add all dependencies that aren't in
    // parsed_files to already_seen.  This will short circuit the recursion
    // in GetTransitiveDependencies.
    std::set<const FileDescriptor*> to_output;
    to_output.insert(parsed_files.begin(), parsed_files.end());
    for (int i = 0; i < parsed_files.size(); i++) {
      const FileDescriptor* file = parsed_files[i];
      for (int j = 0; j < file->dependency_count(); j++) {
        const FileDescriptor* dependency = file->dependency(j);
        // if the dependency isn't in parsed files, mark it as already seen
        if (to_output.find(dependency) == to_output.end()) {
          already_seen.insert(dependency);
        }
      }
    }
  }
  for (int i = 0; i < parsed_files.size(); i++) {
    GetTransitiveDependencies(parsed_files[i],
                              true,  // Include json_name
                              source_info_in_descriptor_set_, &already_seen,
                              file_set.mutable_file());
  }

  int fd;
  do {
    fd = open(descriptor_set_out_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_out_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);

  {
    io::CodedOutputStream coded_out(&out);
    // Determinism is useful here because build outputs are sometimes checked
    // into version control.
    coded_out.SetSerializationDeterministic(true);
    if (!file_set.SerializeToCodedStream(&coded_out)) {
      std::cerr << descriptor_set_out_name_ << ": " << strerror(out.GetErrno())
                << std::endl;
      out.Close();
      return false;
    }
  }

  if (!out.Close()) {
    std::cerr << descriptor_set_out_name_ << ": " << strerror(out.GetErrno())
              << std::endl;
    return false;
  }

  return true;
}